

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void world_spawn_npcs(void *world_void)

{
  undefined8 *puVar1;
  NPC *this;
  bool bVar2;
  mapped_type *pmVar3;
  ENF_Data *pEVar4;
  undefined8 *puVar5;
  long *plVar6;
  allocator<char> local_71;
  long *local_70;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_68;
  double local_60;
  double local_58;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"SpawnRate",&local_71);
  local_68 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)((long)world_void + 0x198);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_68,&local_50);
  local_58 = util::variant::GetFloat(pmVar3);
  std::__cxx11::string::~string((string *)&local_50);
  local_60 = Timer::GetTime();
  plVar6 = *(long **)((long)world_void + 0x4c8);
  local_70 = *(long **)((long)world_void + 0x4d0);
  do {
    if (plVar6 == local_70) {
      return;
    }
    puVar1 = *(undefined8 **)(*plVar6 + 0x40);
    for (puVar5 = *(undefined8 **)(*plVar6 + 0x38); puVar5 != puVar1; puVar5 = puVar5 + 1) {
      this = (NPC *)*puVar5;
      if ((this->alive == false) &&
         ((double)(int)this->spawn_time * local_58 + this->dead_since < local_60)) {
        pEVar4 = NPC::ENF(this);
        if (pEVar4->child == 0) {
LAB_00176ab6:
          NPC::Spawn(this,(NPC *)0x0);
        }
        else if ((this->parent != (NPC *)0x0) && (this->parent->alive == true)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"RespawnBossChildren",&local_71);
          pmVar3 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_68,&local_50);
          bVar2 = util::variant::GetBool(pmVar3);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar2) goto LAB_00176ab6;
        }
      }
    }
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

void world_spawn_npcs(void *world_void)
{
	World *world(static_cast<World *>(world_void));

	double spawnrate = world->config["SpawnRate"];
	double current_time = Timer::GetTime();
	UTIL_FOREACH(world->maps, map)
	{
		UTIL_FOREACH(map->npcs, npc)
		{
			if ((!npc->alive && npc->dead_since + (double(npc->spawn_time) * spawnrate) < current_time)
			 && (!npc->ENF().child || (npc->parent && npc->parent->alive && world->config["RespawnBossChildren"])))
			{
#ifdef DEBUG
				Console::Dbg("Spawning NPC %i on map %i", npc->id, map->id);
#endif // DEBUG
				npc->Spawn();
			}
		}
	}
}